

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Hash_MD5.c
# Opt level: O1

void Hacl_Hash_MD5_update_last(uint32_t *s,uint64_t prev_len,uint8_t *input,uint32_t input_len)

{
  uint uVar1;
  int iVar2;
  ulong __n;
  uint8_t tmp_twoblocks [128];
  uint8_t local_b8;
  undefined1 auStack_b7 [15];
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  __n = (ulong)(input_len & 0x3f);
  Hacl_Hash_MD5_update_multi(s,input,input_len >> 6);
  iVar2 = (int)(prev_len + input_len);
  uVar1 = 0x37U - iVar2 & 0x3f;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_a8 = 0;
  uStack_a0 = 0;
  _local_b8 = 0;
  auStack_b7._7_8_ = 0;
  memcpy(&local_b8,input + (input_len & 0xffffffc0),__n);
  (&local_b8)[__n] = 0x80;
  if (uVar1 != 0) {
    memset(auStack_b7 + __n,0,(ulong)(0x37U - iVar2 & 0x3f));
  }
  *(uint64_t *)(auStack_b7 + __n + uVar1) = (prev_len + input_len) * 8;
  Hacl_Hash_MD5_update_multi(s,&local_b8,(input_len & 0x3f) + uVar1 + 9 >> 6);
  return;
}

Assistant:

void
Hacl_Hash_MD5_update_last(uint32_t *s, uint64_t prev_len, uint8_t *input, uint32_t input_len)
{
  uint32_t blocks_n = input_len / 64U;
  uint32_t blocks_len = blocks_n * 64U;
  uint8_t *blocks = input;
  uint32_t rest_len = input_len - blocks_len;
  uint8_t *rest = input + blocks_len;
  Hacl_Hash_MD5_update_multi(s, blocks, blocks_n);
  uint64_t total_input_len = prev_len + (uint64_t)input_len;
  uint32_t pad_len = 1U + (128U - (9U + (uint32_t)(total_input_len % (uint64_t)64U))) % 64U + 8U;
  uint32_t tmp_len = rest_len + pad_len;
  uint8_t tmp_twoblocks[128U] = { 0U };
  uint8_t *tmp = tmp_twoblocks;
  uint8_t *tmp_rest = tmp;
  uint8_t *tmp_pad = tmp + rest_len;
  memcpy(tmp_rest, rest, rest_len * sizeof (uint8_t));
  pad(total_input_len, tmp_pad);
  Hacl_Hash_MD5_update_multi(s, tmp, tmp_len / 64U);
}